

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O1

void __thiscall
r_exec::_Mem::pack_fact_object
          (_Mem *this,Code *fact_object,Code *hlp,uint16_t *write_index,
          vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_> *references)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  _Object *p_Var3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  ushort uVar8;
  Atom p_atom;
  P<r_code::Code> local_58;
  ushort *local_50;
  undefined4 local_44;
  vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *local_40;
  uint local_34;
  undefined4 extraout_var_00;
  
  local_34 = (uint)*write_index;
  local_50 = write_index;
  local_40 = (vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)references;
  iVar2 = (*(fact_object->super__Object)._vptr__Object[6])(fact_object);
  if ((short)iVar2 != 0) {
    uVar6 = 0;
    do {
      iVar2 = (*(fact_object->super__Object)._vptr__Object[4])(fact_object,(ulong)uVar6);
      local_44 = *(undefined4 *)CONCAT44(extraout_var,iVar2);
      cVar1 = r_code::Atom::getDescriptor();
      uVar8 = (ushort)&local_58;
      if (cVar1 == -0x7c) {
        r_code::Atom::asIndex();
        r_code::Atom::IPointer(uVar8);
        iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),(Atom *)&local_58);
LAB_00189f44:
        r_code::Atom::~Atom((Atom *)&local_58);
      }
      else if (cVar1 == -0x7b) {
        r_code::Atom::asIndex();
        iVar2 = (*(fact_object->super__Object)._vptr__Object[9])(fact_object);
        p_Var3 = (_Object *)CONCAT44(extraout_var_00,iVar2);
        lVar4 = (long)*(pointer *)(local_40 + 8) - *(long *)local_40;
        if (lVar4 != 0) {
          uVar7 = 0;
          uVar5 = 0;
          do {
            if (*(_Object **)(*(long *)local_40 + uVar7 * 8) == p_Var3) {
              r_code::Atom::RPointer(uVar8);
              iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
              r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar2),(Atom *)&local_58);
              goto LAB_00189f44;
            }
            uVar5 = uVar5 + 1;
            uVar7 = (ulong)(uVar5 & 0xffff);
          } while (uVar7 < (ulong)(lVar4 >> 3));
        }
        r_code::Atom::RPointer(uVar8);
        iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),(Atom *)&local_58);
        r_code::Atom::~Atom((Atom *)&local_58);
        if (p_Var3 != (_Object *)0x0) {
          LOCK();
          (p_Var3->refCount).super___atomic_base<long>._M_i =
               (p_Var3->refCount).super___atomic_base<long>._M_i + 1;
          UNLOCK();
        }
        local_58.object = p_Var3;
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>(local_40,&local_58);
        if (local_58.object != (_Object *)0x0) {
          LOCK();
          ((local_58.object)->refCount).super___atomic_base<long>._M_i =
               ((local_58.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_58.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(local_58.object)->_vptr__Object[1])();
          }
        }
      }
      else {
        iVar2 = (*(hlp->super__Object)._vptr__Object[4])(hlp,(ulong)*local_50);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar2),(Atom *)&local_44);
      }
      *local_50 = *local_50 + 1;
      r_code::Atom::~Atom((Atom *)&local_44);
      uVar6 = uVar6 + 1;
      iVar2 = (*(fact_object->super__Object)._vptr__Object[6])(fact_object);
    } while (uVar6 < (ushort)iVar2);
  }
  return;
}

Assistant:

void _Mem::pack_fact_object(Code *fact_object, Code *hlp, uint16_t &write_index, std::vector<P<Code> > *references) const
{
    uint16_t offset = write_index;

    for (uint16_t i = 0; i < fact_object->code_size(); ++i) {
        Atom p_atom = fact_object->code(i);

        switch (p_atom.getDescriptor()) {
        case Atom::R_PTR: { // append this reference to the hlp's if not already there.
            Code *reference = fact_object->get_reference(p_atom.asIndex());
            bool found = false;

            for (uint16_t i = 0; i < references->size(); ++i) {
                if ((*references)[i] == reference) {
                    hlp->code(write_index) = Atom::RPointer(i);
                    found = true;
                    break;
                }
            }

            if (!found) {
                hlp->code(write_index) = Atom::RPointer(references->size());
                references->push_back(reference);
            }

            ++write_index;
            break;
        }

        case Atom::I_PTR: // offset the ptr by write_index. PB HERE.
            hlp->code(write_index) = Atom::IPointer(offset + p_atom.asIndex());
            ++write_index;
            break;

        default:
            hlp->code(write_index) = p_atom;
            ++write_index;
            break;
        }
    }
}